

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.h
# Opt level: O0

void __thiscall crnlib::image_utils::resample_params::resample_params(resample_params *this)

{
  resample_params *this_local;
  
  this->m_dst_width = 0;
  this->m_dst_height = 0;
  this->m_pFilter = "lanczos4";
  this->m_filter_scale = 1.0;
  this->m_srgb = true;
  this->m_wrapping = false;
  this->m_first_comp = 0;
  this->m_num_comps = 4;
  this->m_source_gamma = 2.2;
  this->m_multithreaded = true;
  return;
}

Assistant:

resample_params()
      : m_dst_width(0),
        m_dst_height(0),
        m_pFilter("lanczos4"),
        m_filter_scale(1.0f),
        m_srgb(true),
        m_wrapping(false),
        m_first_comp(0),
        m_num_comps(4),
        m_source_gamma(2.2f),  // 1.75f
        m_multithreaded(true) {
  }